

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O3

void __thiscall
ritobin::io::text_write_impl::BinTextWriter::
write_items<std::vector<ritobin::Element,std::allocator<ritobin::Element>>>
          (BinTextWriter *this,vector<ritobin::Element,_std::allocator<ritobin::Element>_> *items)

{
  pointer pEVar1;
  vector<char,_std::allocator<char>_> *this_00;
  size_t sVar2;
  size_t sVar3;
  pointer item;
  value_type_conflict local_19;
  
  if ((items->super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (items->super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    TextWriter::write_raw<3ul>(&this->writer,(char (*) [3])"{\n");
    sVar2 = (this->writer).indent_size_;
    sVar3 = (this->writer).ident_ + sVar2;
    (this->writer).ident_ = sVar3;
    item = (items->super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>)._M_impl.
           super__Vector_impl_data._M_start;
    pEVar1 = (items->super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (item != pEVar1) {
      do {
        write_item(this,item);
        item = item + 1;
      } while (item != pEVar1);
      sVar2 = (this->writer).indent_size_;
      sVar3 = (this->writer).ident_;
    }
    (this->writer).ident_ = sVar3 - sVar2;
    this_00 = (this->writer).buffer_;
    local_19 = ' ';
    std::vector<char,_std::allocator<char>_>::_M_fill_insert
              (this_00,(iterator)
                       (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish,sVar3 - sVar2,&local_19);
    TextWriter::write_raw<2ul>(&this->writer,(char (*) [2])0x139ae9);
    return;
  }
  TextWriter::write_raw<3ul>(&this->writer,(char (*) [3])"{}");
  return;
}

Assistant:

void write_items(T const& items) noexcept {
            if (items.empty()) {
                writer.write_raw("{}");
                return;
            }
            writer.write_raw("{\n");
            writer.ident_inc();
            for (auto const& item : items) {
                write_item(item);
            }
            writer.ident_dec();
            writer.pad();
            writer.write_raw("}");
        }